

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.H
# Opt level: O1

int __thiscall Fl_Input::kf_move_char_left(Fl_Input *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = (this->super_Fl_Input_).position_ + -1;
  iVar3 = iVar4;
  if (((uint)Fl::e_state >> 0x10 & 1) != 0) {
    iVar3 = (this->super_Fl_Input_).mark_;
  }
  iVar4 = Fl_Input_::position(&this->super_Fl_Input_,iVar4,iVar3);
  bVar1 = Fl::option(OPTION_ARROW_FOCUS);
  bVar2 = Fl::option(OPTION_ARROW_FOCUS);
  iVar3 = 1;
  if (bVar2) {
    iVar3 = (uint)!bVar1 + iVar4;
  }
  return iVar3;
}

Assistant:

int position() const {return position_;}